

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator fmt::v7::
         vformat_to<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                   (iterator out,basic_string_view<char> format_str,
                   basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                   args,locale_ref loc)

{
  format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *end;
  format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *end_00;
  format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *pfVar1;
  format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *begin;
  buffer_appender<char> bVar2;
  char *pcVar3;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar4;
  type tVar5;
  size_t __n;
  code *pcVar6;
  float value;
  format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *end_01;
  undefined1 in_stack_00000008 [16];
  writer wStack_88;
  writer write;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_70;
  format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  h;
  
  pcVar3 = (char *)format_str.size_;
  begin = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
           *)format_str.data_;
  h.parse_context.format_str_.data_ = (char *)args.field_1;
  h._0_8_ = args.desc_;
  if ((pcVar3 != (char *)0x2) || (*(short *)begin != 0x7d7b)) {
    h.parse_context.format_str_.size_ = h.parse_context.format_str_.size_ & 0xffffffff00000000;
    end = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
           *)(pcVar3 + (long)&begin->field_0x0);
    h.parse_context._16_8_ =
         out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    h.context.out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)h._0_8_;
    h.context.args_.desc_ = (unsigned_long_long)h.parse_context.format_str_.data_;
    h.context.args_.field_1 =
         (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
          )loc.locale_;
    if ((long)pcVar3 < 0x20) {
      pfVar1 = begin;
      if (pcVar3 != (char *)0x0) {
        end_01 = begin;
        do {
          h.parse_context.format_str_.data_ = pcVar3;
          h._0_8_ = pfVar1;
          end_00 = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)&end_01->field_0x1;
          if (*(char *)end_01 == '}') {
            if ((end_00 == end) || (*(char *)end_00 != '}')) {
              detail::error_handler::on_error
                        ((error_handler *)
                         out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                         "unmatched \'}\' in format string");
            }
            out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
                 (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
                 (back_insert_iterator<fmt::v7::detail::buffer<char>_>)&local_70;
            detail::
            format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            ::on_text((format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                       *)&local_70,(char *)begin,(char *)end_00);
            end_00 = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)&end_01->field_0x2;
            begin = end_00;
          }
          else if (*(char *)end_01 == '{') {
            detail::
            format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            ::on_text((format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                       *)&local_70,(char *)begin,(char *)end_01);
            end_00 = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)detail::
                        parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                                  ((char *)end_01,(char *)end,
                                   (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                                    *)&local_70);
            out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
                 (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
                 (back_insert_iterator<fmt::v7::detail::buffer<char>_>)end_01;
            begin = end_00;
          }
          end_01 = end_00;
          pfVar1 = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)h._0_8_;
          pcVar3 = h.parse_context.format_str_.data_;
        } while (end_00 != end);
      }
      h.parse_context.format_str_.data_ = pcVar3;
      h._0_8_ = pfVar1;
      detail::
      format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::on_text((format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 *)&local_70,(char *)begin,(char *)end);
      return (iterator)(back_insert_iterator<fmt::v7::detail::buffer<char>_>)h.parse_context._16_8_;
    }
    wStack_88.handler_ =
         (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          *)&local_70;
    pfVar1 = begin;
    do {
      h.parse_context.format_str_.data_ = pcVar3;
      h._0_8_ = pfVar1;
      pfVar1 = begin;
      if (*(char *)begin != '{') {
        __n = (long)end - (long)&begin->field_0x1;
        if ((long)__n < 0) {
          detail::assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
                              ,0x13c,"negative value");
        }
        pfVar1 = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)memchr(&begin->field_0x1,0x7b,__n);
        if (pfVar1 == (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                       *)0x0) {
          detail::
          parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&>
          ::writer::operator()(&wStack_88,(char *)begin,(char *)end);
          return (iterator)
                 (back_insert_iterator<fmt::v7::detail::buffer<char>_>)h.parse_context._16_8_;
        }
      }
      detail::
      parse_format_string<false,_char,_fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&>
      ::writer::operator()(&wStack_88,(char *)begin,(char *)pfVar1);
      begin = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               *)detail::
                 parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                           ((char *)pfVar1,(char *)end,
                            (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)&local_70);
      pfVar1 = (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)h._0_8_;
      pcVar3 = h.parse_context.format_str_.data_;
      if (begin == end) {
        return (iterator)
               (back_insert_iterator<fmt::v7::detail::buffer<char>_>)h.parse_context._16_8_;
      }
    } while( true );
  }
  if ((long)h._0_8_ < 0) {
    if (((int)(type)args.desc_ < 1) ||
       (tVar5 = ((format_arg *)h.parse_context.format_str_.data_)->type_, tVar5 == none_type))
    goto LAB_003edfdd;
  }
  else {
    tVar5 = (type)args.desc_ & custom_type;
    if (((undefined1  [16])args & (undefined1  [16])0xf) == (undefined1  [16])0x0) {
LAB_003edfdd:
      detail::error_handler::on_error
                ((error_handler *)
                 out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                 "argument not found");
    }
  }
  bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       *(back_insert_iterator<fmt::v7::detail::buffer<char>_> *)
        &((value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         h.parse_context.format_str_.data_)->field_0;
  pcVar6 = *(code **)((long)&((value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)h.parse_context.format_str_.data_)->field_0 + 8);
  value = bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_;
  switch(tVar5) {
  case int_type:
    bVar2 = detail::write<char,_fmt::v7::detail::buffer_appender<char>,_int,_0>
                      ((buffer_appender<char>)
                       out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                       (int)value);
    return (iterator)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  case uint_type:
    bVar2 = detail::write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                      ((buffer_appender<char>)
                       out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                       (uint)value);
    return (iterator)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  case long_long_type:
    bVar2 = detail::write<char,_fmt::v7::detail::buffer_appender<char>,_long_long,_0>
                      ((buffer_appender<char>)
                       out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                       (longlong)
                       bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    return (iterator)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  case ulong_long_type:
    bVar2 = detail::write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long_long,_0>
                      ((buffer_appender<char>)
                       out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                       (unsigned_long_long)
                       bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    return (iterator)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  case int128_type:
    bVar2 = detail::write<char,_fmt::v7::detail::buffer_appender<char>,___int128,_0>
                      ((detail *)
                       out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                       bVar2,(__int128)in_stack_00000008);
    return (iterator)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  case uint128_type:
    bVar2 = detail::write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned___int128,_0>
                      ((detail *)
                       out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                       bVar2,(unsigned___int128)in_stack_00000008);
    return (iterator)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  case bool_type:
    pcVar3 = "false";
    if (((ulong)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container & 1) != 0
       ) {
      pcVar3 = "true";
    }
    pcVar6 = (code *)((long)&((buffer<char> *)pcVar3)->_vptr_buffer + ((ulong)((uint)value & 1) ^ 5)
                     );
    break;
  case char_type:
    bVar2 = detail::write<char,fmt::v7::detail::buffer_appender<char>>
                      ((buffer_appender<char>)
                       out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                       (char)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container);
    return (iterator)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  case float_type:
    bVar2 = detail::write<char,_fmt::v7::detail::buffer_appender<char>,_float,_0>
                      ((buffer_appender<char>)
                       out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                       value);
    return (iterator)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  case double_type:
    bVar2 = detail::write<char,_fmt::v7::detail::buffer_appender<char>,_double,_0>
                      ((buffer_appender<char>)
                       out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                       (double)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container);
    return (iterator)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  case last_numeric_type:
    bVar4.container =
         (buffer<char> *)
         detail::write<char,_fmt::v7::detail::buffer_appender<char>,_long_double,_0>
                   (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                    (((value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                       *)h.parse_context.format_str_.data_)->field_0).long_double_value);
    return (iterator)(back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar4.container;
  case cstring_type:
    bVar2 = detail::write<char,fmt::v7::detail::buffer_appender<char>>
                      ((buffer_appender<char>)
                       out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                       (char *)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container);
    return (iterator)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  case string_type:
    pcVar6 = pcVar6 + (long)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                            container;
    pcVar3 = (char *)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    break;
  case pointer_type:
    bVar2 = detail::write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>
                      ((buffer_appender<char>)
                       out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                       (unsigned_long)
                       bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                       (basic_format_specs<char> *)0x0);
    return (iterator)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  case custom_type:
    wStack_88.handler_ =
         (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          *)0x0;
    write.handler_ =
         (format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          *)0x0;
    local_70 = out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    h.parse_context.format_str_.size_ = (size_t)loc.locale_;
    (*pcVar6)(bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,&wStack_88,
              &local_70);
    return (iterator)(back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_70.container;
  default:
    detail::assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format.h"
                        ,0x6d7,"");
  }
  detail::buffer<char>::append<char>
            ((buffer<char> *)
             out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,pcVar3,
             (char *)pcVar6);
  return (iterator)
         out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

typename Context::iterator vformat_to(
    typename ArgFormatter::iterator out, basic_string_view<Char> format_str,
    basic_format_args<Context> args,
    detail::locale_ref loc = detail::locale_ref()) {
  if (format_str.size() == 2 && detail::equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) detail::error_handler().on_error("argument not found");
    using iterator = typename ArgFormatter::iterator;
    return visit_format_arg(
        detail::default_arg_formatter<iterator, Char>{out, args, loc}, arg);
  }
  detail::format_handler<ArgFormatter, Char, Context> h(out, format_str, args,
                                                        loc);
  detail::parse_format_string<false>(format_str, h);
  return h.context.out();
}